

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::pushError(Reader *this,Value *value,String *message)

{
  Location pCVar1;
  Location pCVar2;
  long lVar3;
  ptrdiff_t pVar4;
  ptrdiff_t pVar5;
  undefined1 auStack_88 [8];
  ErrorInfo info;
  Token token;
  ptrdiff_t length;
  String *message_local;
  Value *value_local;
  Reader *this_local;
  
  lVar3 = (long)this->end_ - (long)this->begin_;
  pVar4 = Value::getOffsetStart(value);
  if ((pVar4 <= lVar3) && (pVar4 = Value::getOffsetLimit(value), pVar4 <= lVar3)) {
    info.extra_._0_4_ = tokenError;
    pCVar1 = this->begin_;
    pVar4 = Value::getOffsetStart(value);
    pCVar2 = this->begin_;
    pVar5 = Value::getOffsetLimit(value);
    ErrorInfo::ErrorInfo((ErrorInfo *)auStack_88);
    auStack_88._4_4_ = info.extra_._4_4_;
    auStack_88._0_4_ = (TokenType)info.extra_;
    info.token_._0_8_ = pCVar1 + pVar4;
    info.token_.start_ = pCVar2 + pVar5;
    std::__cxx11::string::operator=((string *)&info.token_.end_,(string *)message);
    info.message_.field_2._8_8_ = 0;
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::push_back
              (&this->errors_,(value_type *)auStack_88);
    ErrorInfo::~ErrorInfo((ErrorInfo *)auStack_88);
    return true;
  }
  return false;
}

Assistant:

bool Reader::pushError(const Value& value, const String& message) {
  ptrdiff_t const length = end_ - begin_;
  if (value.getOffsetStart() > length || value.getOffsetLimit() > length)
    return false;
  Token token;
  token.type_ = tokenError;
  token.start_ = begin_ + value.getOffsetStart();
  token.end_ = begin_ + value.getOffsetLimit();
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = nullptr;
  errors_.push_back(info);
  return true;
}